

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int addToSavepointBitvecs(Pager *pPager,Pgno pgno)

{
  uint uVar1;
  PagerSavepoint *p;
  int local_18;
  int rc;
  int ii;
  Pgno pgno_local;
  Pager *pPager_local;
  
  p._4_4_ = 0;
  for (local_18 = 0; local_18 < pPager->nSavepoint; local_18 = local_18 + 1) {
    if (pgno <= pPager->aSavepoint[local_18].nOrig) {
      uVar1 = sqlite3BitvecSet(pPager->aSavepoint[local_18].pInSavepoint,pgno);
      p._4_4_ = uVar1 | p._4_4_;
    }
  }
  return p._4_4_;
}

Assistant:

static int addToSavepointBitvecs(Pager *pPager, Pgno pgno){
  int ii;                   /* Loop counter */
  int rc = SQLITE_OK;       /* Result code */

  for(ii=0; ii<pPager->nSavepoint; ii++){
    PagerSavepoint *p = &pPager->aSavepoint[ii];
    if( pgno<=p->nOrig ){
      rc |= sqlite3BitvecSet(p->pInSavepoint, pgno);
      testcase( rc==SQLITE_NOMEM );
      assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
    }
  }
  return rc;
}